

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opn_chip_base.h
# Opt level: O0

void __thiscall
OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>::OPNChipBaseBufferedT
          (OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U> *this,OPNFamily f)

{
  OPNFamily f_local;
  OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U> *this_local;
  
  OPNChipBaseT<NP2OPNA<FM::OPNB>_>::OPNChipBaseT(&this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>,f);
  (this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).super_OPNChipBase._vptr_OPNChipBase =
       (_func_int **)&PTR__OPNChipBaseBufferedT_002fb938;
  *(undefined4 *)&(this->super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>).field_0x34 = 0;
  return;
}

Assistant:

explicit OPNChipBaseBufferedT(OPNFamily f)
        : OPNChipBaseT<T>(f), m_bufferIndex(0) {}